

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_quaternion rf_quaternion_from_matrix(rf_mat mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  rf_quaternion rVar5;
  float in_stack_00000008;
  float in_stack_0000000c;
  
  fVar4 = in_stack_00000008 + mat.m12 + mat.m2 + mat.m7;
  if (fVar4 <= 0.0) {
    if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
      if (mat.m12 <= mat.m2) {
        fVar4 = ((mat.m2 + 1.0) - in_stack_00000008) - mat.m12;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar2 = 1.0 / (fVar4 + fVar4);
        fVar1 = (mat.m8 - in_stack_0000000c) * fVar2;
        fVar3 = fVar2 * (mat.m0 + mat.m9);
        fVar2 = fVar2 * (mat.m1 + mat.m13);
        fVar4 = (fVar4 + fVar4) * 0.25;
      }
      else {
        fVar2 = ((mat.m12 + 1.0) - in_stack_00000008) - mat.m2;
        if (fVar2 < 0.0) {
          fVar2 = sqrtf(fVar2);
        }
        else {
          fVar2 = SQRT(fVar2);
        }
        fVar3 = 1.0 / (fVar2 + fVar2);
        fVar1 = (mat.m0 - mat.m9) * fVar3;
        fVar4 = (mat.m1 + mat.m13) * fVar3;
        fVar3 = (in_stack_0000000c + mat.m8) * fVar3;
        fVar2 = (fVar2 + fVar2) * 0.25;
      }
    }
    else {
      fVar2 = ((in_stack_00000008 + 1.0) - mat.m12) - mat.m2;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar4 = 1.0 / (fVar2 + fVar2);
      fVar1 = (mat.m13 - mat.m1) * fVar4;
      fVar3 = (fVar2 + fVar2) * 0.25;
      fVar2 = fVar4 * (in_stack_0000000c + mat.m8);
      fVar4 = (mat.m0 + mat.m9) * fVar4;
    }
  }
  else {
    fVar4 = fVar4 + 1.0;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar2 = 1.0 / (fVar4 + fVar4);
    fVar1 = (fVar4 + fVar4) * 0.25;
    fVar4 = (mat.m8 - in_stack_0000000c) * fVar2;
    fVar3 = fVar2 * (mat.m13 - mat.m1);
    fVar2 = fVar2 * (mat.m0 - mat.m9);
  }
  rVar5.w = fVar1;
  rVar5.z = fVar4;
  rVar5.y = fVar2;
  rVar5.x = fVar3;
  return rVar5;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_matrix(rf_mat mat)
{
    rf_quaternion result = {0};

    float trace = rf_mat_trace(mat);

    if (trace > 0.0f)
    {
        float s = (float) sqrt(trace + 1) * 2.0f;
        float invS = 1.0f / s;

        result.w = s * 0.25f;
        result.x = (mat.m6 - mat.m9) * invS;
        result.y = (mat.m8 - mat.m2) * invS;
        result.z = (mat.m1 - mat.m4) * invS;
    } else
    {
        float m00 = mat.m0, m11 = mat.m5, m22 = mat.m10;

        if (m00 > m11 && m00 > m22)
        {
            float s = (float) sqrt(1.0f + m00 - m11 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m6 - mat.m9) * invS;
            result.x = s * 0.25f;
            result.y = (mat.m4 + mat.m1) * invS;
            result.z = (mat.m8 + mat.m2) * invS;
        } else if (m11 > m22)
        {
            float s = (float) sqrt(1.0f + m11 - m00 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m8 - mat.m2) * invS;
            result.x = (mat.m4 + mat.m1) * invS;
            result.y = s * 0.25f;
            result.z = (mat.m9 + mat.m6) * invS;
        } else
        {
            float s = (float) sqrt(1.0f + m22 - m00 - m11) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m1 - mat.m4) * invS;
            result.x = (mat.m8 + mat.m2) * invS;
            result.y = (mat.m9 + mat.m6) * invS;
            result.z = s * 0.25f;
        }
    }

    return result;
}